

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
deqp::gles31::Functional::anon_unknown_0::shuffledRange
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int from,int to,int seed)

{
  int iVar1;
  size_type __n;
  reference pvVar2;
  iterator first;
  iterator last;
  int local_48;
  undefined1 local_44 [4];
  int ndx;
  Random rng;
  allocator<int> local_22;
  byte local_21;
  int local_20;
  deUint32 local_1c;
  int count;
  int seed_local;
  int to_local;
  int from_local;
  vector<int,_std::allocator<int>_> *retval;
  
  local_20 = to - from;
  local_21 = 0;
  __n = (size_type)local_20;
  local_1c = seed;
  count = to;
  seed_local = from;
  _to_local = __return_storage_ptr__;
  std::allocator<int>::allocator(&local_22);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_22);
  std::allocator<int>::~allocator(&local_22);
  de::Random::Random((Random *)local_44,local_1c);
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    iVar1 = local_48 + seed_local;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_48);
    *pvVar2 = iVar1;
  }
  first = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  last = std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_44,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)last._M_current);
  local_21 = 1;
  de::Random::~Random((Random *)local_44);
  if ((local_21 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> shuffledRange (int from, int to, int seed)
{
	const int	count	= to - from;

	vector<int> retval	(count);
	de::Random	rng		(seed);

	DE_ASSERT(count > 0);

	for (int ndx = 0; ndx < count; ndx++)
		retval[ndx] = ndx + from;

	rng.shuffle(retval.begin(), retval.end());
	return retval;
}